

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O3

void __thiscall Tracker::end(Tracker *this,string *_track)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>_>
  *this_00;
  pointer *ppSVar1;
  iterator __position;
  long lVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  StatSample stat;
  StatSample local_38;
  
  if (this->m_running == true) {
    lVar2 = std::chrono::_V2::system_clock::now();
    this_00 = &this->m_data;
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>_>
            ::find(&this_00->_M_t,_track);
    if ((_Rb_tree_header *)iVar3._M_node == &(this->m_data)._M_t._M_impl.super__Rb_tree_header) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->m_tracks,_track);
    }
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>_>
             ::operator[](this_00,_track);
    local_38.startMs = (double)((pmVar4->start).__d.__r / 1000) * 0.001 - this->m_trackerStart;
    local_38.endMs = (double)(lVar2 / 1000) * 0.001 - this->m_trackerStart;
    local_38.durationMs = local_38.endMs - local_38.startMs;
    if (0.0 < local_38.startMs) {
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>_>
               ::operator[](this_00,_track);
      __position._M_current =
           (pmVar4->samples).super__Vector_base<StatSample,_std::allocator<StatSample>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pmVar4->samples).super__Vector_base<StatSample,_std::allocator<StatSample>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<StatSample,std::allocator<StatSample>>::_M_realloc_insert<StatSample_const&>
                  ((vector<StatSample,std::allocator<StatSample>> *)&pmVar4->samples,__position,
                   &local_38);
      }
      else {
        (__position._M_current)->durationMs = local_38.durationMs;
        (__position._M_current)->startMs = local_38.startMs;
        (__position._M_current)->endMs = local_38.endMs;
        ppSVar1 = &(pmVar4->samples).super__Vector_base<StatSample,_std::allocator<StatSample>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
    }
  }
  return;
}

Assistant:

void Tracker::end(const std::string& _track) {
    if (!m_running)
        return;

    auto sample_end = std::chrono::high_resolution_clock::now();

    if ( m_data.find(_track) == m_data.end() )
        m_tracks.push_back(_track);

    auto start = std::chrono::time_point_cast<std::chrono::microseconds>(m_data[_track].start).time_since_epoch();
    auto end = std::chrono::time_point_cast<std::chrono::microseconds>(sample_end).time_since_epoch();
    
    StatSample stat;
    stat.startMs = start.count() * 0.001 - m_trackerStart;
    stat.endMs = end.count() * 0.001 - m_trackerStart;
    stat.durationMs = stat.endMs - stat.startMs;

    if (stat.startMs > 0)
        m_data[_track].samples.push_back( stat );
}